

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cpp
# Opt level: O2

ssize_t readn(int fd,string *inBuffer,bool *zero)

{
  ssize_t sVar1;
  int *piVar2;
  ssize_t sVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1058;
  char buff [4096];
  
  sVar3 = 0;
  do {
    while( true ) {
      sVar1 = read(fd,buff,0x1000);
      if (sVar1 < 0) break;
      if (sVar1 == 0) {
        *zero = true;
        return sVar3;
      }
      local_1058._M_dataplus._M_p = (pointer)&local_1058.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_1058,buff,buff + sVar1);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (inBuffer,&local_1058);
      sVar3 = sVar3 + sVar1;
      std::__cxx11::string::~string((string *)&local_1058);
    }
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  if (*piVar2 != 0xb) {
    perror("read error");
    sVar3 = -1;
  }
  return sVar3;
}

Assistant:

ssize_t readn(int fd, std::string &inBuffer, bool &zero){
    ssize_t nread=0;
    ssize_t readSum=0;

    while (true) {
        char buff[MAX_BUFF];
        if((nread=read(fd, buff, MAX_BUFF))<0){
            if(errno==EINTR){
                continue;;
            }else if (errno==EAGAIN) {
                return readSum;
            }else {
                perror("read error");
                return -1;
            }
        }else if (nread==0) {
            zero=true;
            break;
        }
        // printf("before inBuffer.size() = %d\n", inBuffer.size());
        // printf("nread = %d\n", nread);
        readSum+=nread;
        // buff += nread;
        inBuffer+=std::string(buff,buff+nread);
        // printf("after inBuffer.size() = %d\n", inBuffer.size());
    }
    return readSum;
}